

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::eval_reflect_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float res;
  float fVar2;
  float local_3c [3];
  Vector<float,_3> res_1;
  float local_20 [2];
  Vector<float,_3> res_2;
  undefined8 local_c;
  float local_4;
  
  local_3c[0] = c->in[0].m_data[2];
  local_3c[1] = c->in[0].m_data[0];
  local_3c[2] = c->in[0].m_data[1];
  local_c = *(undefined8 *)(c->in[1].m_data + 1);
  local_4 = c->in[1].m_data[0];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + *(float *)((long)&local_c + lVar1 * 4) * local_3c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  stack0xffffffffffffffd8 = stack0xffffffffffffffd8 & 0xffffffff00000000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = *(float *)((long)&local_c + lVar1 * 4) * (fVar2 + fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1] = local_3c[lVar1] - res_1.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data._0_8_ = &c->color;
  stack0xffffffffffffffd8 = 0x100000000;
  local_20[0] = 2.8026e-45;
  lVar1 = 2;
  do {
    (c->color).m_data[(int)res_1.m_data[lVar1]] = local_20[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }